

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

char * config_find_string_fallback(map *config_map,char *key,char *fallback)

{
  int *piVar1;
  map_entry *pmVar2;
  
  pmVar2 = map_get(config_map,key);
  if (((pmVar2 != (map_entry *)0x0) && (piVar1 = (int *)pmVar2->value, piVar1 != (int *)0x0)) &&
     (*piVar1 == 3)) {
    fallback = *(char **)(piVar1 + 2);
  }
  return fallback;
}

Assistant:

const char *config_find_string_fallback(const struct map *config_map, const char *key,
                                        const char *fallback)
{
        const char *string = NULL;

        if (config_find_string(config_map, key, &string) != NO_ERROR) {
                return fallback;
        }

        return string;
}